

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O0

int worker_wake(worker_handle *wh)

{
  condvar_handle *condvar;
  int local_1c;
  int ret;
  worker_priv *priv;
  worker_handle *wh_local;
  
  condvar = (condvar_handle *)wh->priv;
  local_1c = -0x16;
  mutex_lock((mutex_handle *)(condvar + 2));
  if (2 < *(uint *)&condvar[7].priv) {
    if (*(int *)&condvar[7].priv == 5) {
      condvar_wake_all(condvar);
    }
    *(undefined4 *)&condvar[7].priv = 4;
    local_1c = 0;
  }
  mutex_unlock((mutex_handle *)(condvar + 2));
  return local_1c;
}

Assistant:

int worker_wake(struct worker_handle *wh)
{
	struct worker_priv *priv = wh->priv;
	int ret = -EINVAL;

	mutex_lock(&priv->mutex);

	if (priv->state > WORKER_STOPPING_AFTER_WORK) {
		if (priv->state == WORKER_IDLE)
			condvar_wake_all(&priv->condvar);
		priv->state = WORKER_SIGNALED;
		ret = 0;
	}

	mutex_unlock(&priv->mutex);

	return ret;
}